

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

void __thiscall QTableModel::itemChanged(QTableModel *this,QTableWidgetItem *item,QList<int> *roles)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long in_RCX;
  int iVar5;
  long lVar6;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  Data *local_20;
  
  local_20 = *(Data **)(in_FS_OFFSET + 0x28);
  if (item != (QTableWidgetItem *)0x0) {
    if (item->d->headerItem == true) {
      lVar2 = (this->verticalHeaderItems).d.size;
      if (lVar2 == 0) {
LAB_0059e3dc:
        in_RCX = -1;
      }
      else {
        lVar6 = -8;
        do {
          lVar1 = lVar2 * -8 + lVar6;
          if (lVar1 == -8) goto LAB_0059e3d6;
          in_RCX = lVar6 + 8;
          lVar3 = lVar6 + 8;
          lVar6 = in_RCX;
        } while (*(QTableWidgetItem **)((long)(this->verticalHeaderItems).d.ptr + lVar3) != item);
        in_RCX = in_RCX >> 3;
LAB_0059e3d6:
        if (lVar1 == -8) goto LAB_0059e3dc;
      }
      iVar4 = (int)in_RCX;
      if (-1 < iVar4) {
        if (*(Data **)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0059e4ed;
        iVar5 = 2;
        goto LAB_0059e4c3;
      }
      lVar2 = (this->horizontalHeaderItems).d.size;
      if (lVar2 == 0) {
LAB_0059e4a0:
        iVar4 = -1;
      }
      else {
        lVar6 = -8;
        do {
          iVar4 = (int)in_RCX;
          lVar1 = lVar2 * -8 + lVar6;
          if (lVar1 == -8) goto LAB_0059e49a;
          in_RCX = lVar6 + 8;
          lVar3 = lVar6 + 8;
          lVar6 = in_RCX;
        } while (*(QTableWidgetItem **)((long)(this->horizontalHeaderItems).d.ptr + lVar3) != item);
        iVar4 = (int)(in_RCX >> 3);
LAB_0059e49a:
        if (lVar1 == -8) goto LAB_0059e4a0;
      }
      if (-1 < iVar4) {
        if (*(Data **)(in_FS_OFFSET + 0x28) == local_20) {
          iVar5 = 1;
LAB_0059e4c3:
          QAbstractItemModel::headerDataChanged((Orientation)this,iVar5,iVar4);
          return;
        }
        goto LAB_0059e4ed;
      }
    }
    else {
      local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      index((QTableModel *)local_38,(char *)this,(int)item);
      if (((-1 < (int)local_38._0_4_) && (-1 < (long)local_38._0_8_)) &&
         ((QTableWidgetItem *)local_28.ptr != (QTableWidgetItem *)0x0)) {
        QAbstractItemModel::dataChanged
                  ((QModelIndex *)this,(QModelIndex *)local_38,(QList_conflict *)local_38);
      }
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0059e4ed:
  __stack_chk_fail();
}

Assistant:

void QTableModel::itemChanged(QTableWidgetItem *item, const QList<int> &roles)
{
    if (!item)
        return;
    if (item->d->headerItem) {
        int row = verticalHeaderItems.indexOf(item);
        if (row >= 0) {
            emit headerDataChanged(Qt::Vertical, row, row);
        } else {
            int column = horizontalHeaderItems.indexOf(item);
            if (column >= 0)
                emit headerDataChanged(Qt::Horizontal, column, column);
        }
    } else {
        QModelIndex idx = index(item);
        if (idx.isValid())
            emit dataChanged(idx, idx, roles);
    }
}